

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_info.h
# Opt level: O1

void __thiscall NamesAndLabels::~NamesAndLabels(NamesAndLabels *this)

{
  pointer pXVar1;
  pointer pXVar2;
  
  pXVar1 = (this->labels).
           super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pXVar1 != (pointer)0x0) {
    operator_delete(pXVar1,(long)(this->labels).
                                 super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pXVar1);
  }
  pXVar2 = (this->objects).
           super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pXVar2 != (pointer)0x0) {
    operator_delete(pXVar2,(long)(this->objects).
                                 super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pXVar2);
  }
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&this->sdk_objects);
  return;
}

Assistant:

NamesAndLabels() = default;